

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall Table_QuotedKey_Test::Table_QuotedKey_Test(Table_QuotedKey_Test *this)

{
  Table_QuotedKey_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Table_QuotedKey_Test_0022bec8;
  return;
}

Assistant:

TEST(Table, QuotedKey) {
    std::istringstream input("[\"table\\ntable\"]");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::table, {"table\ntable"}},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}